

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O2

void crnlib::dxt_fast::eval_colors(color_quad_u8 *pColors,uint c0,uint c1)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  
  unpack_color(pColors,c0);
  unpack_color(pColors + 1,c1);
  bVar1 = (pColors->field_0).field_0.r;
  bVar2 = pColors[1].field_0.field_0.r;
  pColors[2].field_0.field_0.r = (uchar)(((uint)bVar2 + (uint)bVar1 * 2) / 3);
  bVar3 = (pColors->field_0).field_0.g;
  bVar4 = pColors[1].field_0.field_0.g;
  pColors[2].field_0.field_0.g = (uchar)(((uint)bVar4 + (uint)bVar3 * 2) / 3);
  bVar5 = (pColors->field_0).field_0.b;
  bVar6 = pColors[1].field_0.field_0.b;
  pColors[2].field_0.field_0.b = (uchar)(((uint)bVar6 + (uint)bVar5 * 2) / 3);
  pColors[3].field_0.field_0.r = (uchar)(((uint)bVar1 + (uint)bVar2 * 2) / 3);
  pColors[3].field_0.field_0.g = (uchar)(((uint)bVar3 + (uint)bVar4 * 2) / 3);
  pColors[3].field_0.field_0.b = (uchar)(((uint)bVar5 + (uint)bVar6 * 2) / 3);
  return;
}

Assistant:

static inline void eval_colors(color_quad_u8* pColors, uint c0, uint c1) {
  unpack_color(pColors[0], c0);
  unpack_color(pColors[1], c1);

#if 0
         lerp_color(pColors[2], pColors[0], pColors[1], 0x55);
         lerp_color(pColors[3], pColors[0], pColors[1], 0xAA);
#else
  pColors[2].r = (pColors[0].r * 2 + pColors[1].r) / 3;
  pColors[2].g = (pColors[0].g * 2 + pColors[1].g) / 3;
  pColors[2].b = (pColors[0].b * 2 + pColors[1].b) / 3;

  pColors[3].r = (pColors[1].r * 2 + pColors[0].r) / 3;
  pColors[3].g = (pColors[1].g * 2 + pColors[0].g) / 3;
  pColors[3].b = (pColors[1].b * 2 + pColors[0].b) / 3;
#endif
}